

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

uint16_t __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAttribute<unsigned_short>(OgreXmlSerializer *this,char *name)

{
  XmlReader *reader;
  char *pcVar1;
  bool bVar2;
  uint32_t uVar3;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  char *local_18;
  char *name_local;
  OgreXmlSerializer *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  bVar2 = HasAttribute(this,name);
  pcVar1 = local_18;
  if (!bVar2) {
    reader = this->m_reader;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"",&local_71);
    ThrowAttibuteError(reader,&local_38,&local_70);
  }
  uVar3 = ReadAttribute<unsigned_int>(this,local_18);
  return (uint16_t)uVar3;
}

Assistant:

uint16_t OgreXmlSerializer::ReadAttribute<uint16_t>(const char *name) const
{
    if (HasAttribute(name))
    {
        return static_cast<uint16_t>(ReadAttribute<uint32_t>(name));
    }
    else
    {
        ThrowAttibuteError(m_reader, name);
    }
    return 0;
}